

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O1

void __thiscall
AbstractTxIn_IsCoinBaseTest_Test::~AbstractTxIn_IsCoinBaseTest_Test
          (AbstractTxIn_IsCoinBaseTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTxIn, IsCoinBaseTest) {
  const Txid empty_txid = Txid(ByteData256());
  const uint32_t max_vout = std::numeric_limits<uint32_t>::max();
  const uint32_t sequence = 4294967295;
  AbstractTxIn coinbase_input = AbstractTxIn(
    empty_txid, max_vout, sequence);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  coinbase_input = AbstractTxIn(
    empty_txid, max_vout, 0);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  AbstractTxIn not_coinbase = AbstractTxIn(
    empty_txid, 0, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());

  not_coinbase = AbstractTxIn(
    Txid("0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"),
    max_vout, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());
}